

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::verifyImage
          (DepthDrawCase *this,Surface *viewport)

{
  RGBA RVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  ConstPixelBufferAccess local_7c8;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  LogImage local_750;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  LogImageSet local_670;
  MessageBuilder local_630;
  ConstPixelBufferAccess local_4b0;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  LogImage local_438;
  ConstPixelBufferAccess local_3a8;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  LogImage local_330;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  LogImageSet local_250;
  MessageBuilder local_210;
  deUint32 local_90;
  byte local_89;
  RGBA local_88;
  int iStack_84;
  bool error;
  RGBA pixel;
  int x;
  int y;
  PixelBufferAccess local_60;
  byte local_31;
  undefined1 local_30 [7];
  bool anyError;
  Surface errorMask;
  Surface *viewport_local;
  DepthDrawCase *this_local;
  
  errorMask.m_pixels.m_cap = (size_t)viewport;
  iVar3 = tcu::Surface::getWidth(viewport);
  iVar4 = tcu::Surface::getHeight((Surface *)errorMask.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_30,iVar3,iVar4);
  local_31 = 0;
  tcu::Surface::getAccess(&local_60,(Surface *)local_30);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&x,0,0,0,0xff);
  tcu::clear(&local_60,(IVec4 *)&x);
  pixel.m_value = 0;
  do {
    RVar1.m_value = pixel.m_value;
    iVar3 = tcu::Surface::getHeight((Surface *)errorMask.m_pixels.m_cap);
    if (iVar3 <= (int)RVar1.m_value) {
      if ((local_31 & 1) == 0) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_630,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_630,(char (*) [17])"Result image ok.");
        pTVar5 = tcu::MessageBuilder::operator<<
                           (pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"Images",&local_691)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,"Image verification",&local_6b9);
        tcu::LogImageSet::LogImageSet(&local_670,&local_690,&local_6b8);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_670);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_770,"Viewport",&local_771);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_798,"Viewport contents",&local_799);
        tcu::Surface::getAccess(&local_7c8,(Surface *)errorMask.m_pixels.m_cap);
        tcu::LogImage::LogImage
                  (&local_750,&local_770,&local_798,&local_7c8,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_750);
        tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_750);
        std::__cxx11::string::~string((string *)&local_798);
        std::allocator<char>::~allocator(&local_799);
        std::__cxx11::string::~string((string *)&local_770);
        std::allocator<char>::~allocator(&local_771);
        tcu::LogImageSet::~LogImageSet(&local_670);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::allocator<char>::~allocator(&local_6b9);
        std::__cxx11::string::~string((string *)&local_690);
        std::allocator<char>::~allocator(&local_691);
        tcu::MessageBuilder::~MessageBuilder(&local_630);
      }
      else {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_210,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_210,(char (*) [27])"Image verification failed.");
        pTVar5 = tcu::MessageBuilder::operator<<
                           (pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"Images",&local_271)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"Image verification",&local_299);
        tcu::LogImageSet::LogImageSet(&local_250,&local_270,&local_298);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_250);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"Viewport",&local_351);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,"Viewport contents",&local_379);
        tcu::Surface::getAccess(&local_3a8,(Surface *)errorMask.m_pixels.m_cap);
        tcu::LogImage::LogImage
                  (&local_330,&local_350,&local_378,&local_3a8,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_330);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"ErrorMask",&local_459);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_480,"Error mask",&local_481);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_4b0,(Surface *)local_30);
        tcu::LogImage::LogImage
                  (&local_438,&local_458,&local_480,&local_4b0,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_438);
        tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_438);
        std::__cxx11::string::~string((string *)&local_480);
        std::allocator<char>::~allocator(&local_481);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
        tcu::LogImage::~LogImage(&local_330);
        std::__cxx11::string::~string((string *)&local_378);
        std::allocator<char>::~allocator(&local_379);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator(&local_351);
        tcu::LogImageSet::~LogImageSet(&local_250);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator(&local_299);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator(&local_271);
        tcu::MessageBuilder::~MessageBuilder(&local_210);
      }
      bVar2 = local_31 ^ 0xff;
      tcu::Surface::~Surface((Surface *)local_30);
      return (bool)(bVar2 & 1);
    }
    iStack_84 = 0;
    while( true ) {
      iVar3 = iStack_84;
      iVar4 = tcu::Surface::getWidth((Surface *)errorMask.m_pixels.m_cap);
      if (iVar4 <= iVar3) break;
      local_88 = tcu::Surface::getPixel((Surface *)errorMask.m_pixels.m_cap,iStack_84,pixel.m_value)
      ;
      local_89 = 0;
      iVar3 = tcu::RGBA::getGreen(&local_88);
      if (iVar3 == 0xff) {
        iVar3 = tcu::RGBA::getBlue(&local_88);
        if (iVar3 != 0) goto LAB_02380a21;
      }
      else {
LAB_02380a21:
        local_89 = 1;
      }
      RVar1.m_value = pixel.m_value;
      iVar3 = iStack_84;
      if ((local_89 & 1) != 0) {
        local_90 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_30,iVar3,RVar1.m_value,(RGBA)local_90);
        local_31 = 1;
      }
      iStack_84 = iStack_84 + 1;
    }
    pixel.m_value = pixel.m_value + 1;
  } while( true );
}

Assistant:

bool DepthDrawCase::verifyImage (const tcu::Surface& viewport) const
{
	tcu::Surface	errorMask	(viewport.getWidth(), viewport.getHeight());
	bool			anyError	= false;

	tcu::clear(errorMask.getAccess(), tcu::IVec4(0,0,0,255));

	for (int y = 0; y < viewport.getHeight(); ++y)
	for (int x = 0; x < viewport.getWidth(); ++x)
	{
		const tcu::RGBA	pixel		= viewport.getPixel(x, y);
		bool			error		= false;

		// expect green, yellow or a combination of these
		if (pixel.getGreen() != 255 || pixel.getBlue() != 0)
			error = true;

		if (error)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			anyError = true;
		}
	}

	if (anyError)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewport.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewport.getAccess())
			<< tcu::TestLog::EndImageSet;

	return !anyError;
}